

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  ImVec2 size;
  ImVec2 size_00;
  bool bVar1;
  int iVar2;
  float *in_RCX;
  uint in_EDX;
  float *in_RSI;
  char *in_RDI;
  float fVar3;
  float fVar4;
  float bar1_line_y;
  ImRect bar1_bb;
  float alpha;
  float sv_cursor_rad;
  float bar0_line_y;
  int i;
  ImVec2 uv_white;
  ImVec2 trc;
  ImVec2 trb;
  ImVec2 tra;
  int hue_cursor_segments;
  float hue_cursor_rad;
  ImVec2 hue_cursor_pos;
  float sin_hue_angle_1;
  float cos_hue_angle_1;
  ImVec2 gradient_p1;
  ImVec2 gradient_p0;
  int vert_end_idx;
  int vert_start_idx;
  float a1;
  float a0;
  int n;
  int segment_per_arc;
  float aeps;
  ImVec2 sv_cursor_pos;
  ImU32 user_col32_striped_of_alpha;
  ImU32 hue_color32;
  ImVec4 hue_color_f;
  ImU32 col_hues [7];
  ImU32 col_midgrey;
  ImU32 col_white;
  ImU32 col_black;
  int style_alpha8;
  float new_V;
  float new_S;
  float new_H;
  ImGuiColorEditFlags sub_flags;
  ImGuiColorEditFlags sub_flags_to_forward_1;
  bool value_changed_fix_hue_wrap;
  ImVec4 ref_col_v4;
  ImGuiColorEditFlags sub_flags_to_forward;
  ImVec4 col_v4;
  char *label_display_end;
  float ww;
  float vv;
  float uu;
  ImVec2 current_off_unrotated;
  float sin_hue_angle;
  float cos_hue_angle;
  float initial_dist2;
  ImVec2 current_off;
  ImVec2 initial_off;
  bool value_changed_sv;
  bool value_changed_h;
  bool value_changed;
  float B;
  float G;
  float R;
  float V;
  float S;
  float H;
  ImVec2 triangle_pc;
  ImVec2 triangle_pb;
  ImVec2 triangle_pa;
  float triangle_r;
  ImVec2 wheel_center;
  float wheel_r_inner;
  float wheel_r_outer;
  float wheel_thickness;
  float backup_initial_col [4];
  float bars_triangles_half_sz;
  float bar1_pos_x;
  float bar0_pos_x;
  float sv_picker_size;
  float bars_width;
  float square_sz;
  ImVec2 picker_pos;
  bool alpha_bar;
  int components;
  float width;
  ImGuiIO *io;
  ImGuiStyle *style;
  ImDrawList *draw_list;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffb08;
  ImVec2 *pIVar5;
  ImVec2 in_stack_fffffffffffffb10;
  float in_stack_fffffffffffffb18;
  float in_stack_fffffffffffffb1c;
  ImDrawList *in_stack_fffffffffffffb20;
  ImRect *this;
  ImU32 col_bot_right;
  ImVec2 *in_stack_fffffffffffffb28;
  float in_stack_fffffffffffffb30;
  float in_stack_fffffffffffffb34;
  int in_stack_fffffffffffffb38;
  undefined4 uVar6;
  float in_stack_fffffffffffffb3c;
  ImDrawList *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  float in_stack_fffffffffffffb4c;
  float in_stack_fffffffffffffb50;
  ImU32 col_bot_left;
  float in_stack_fffffffffffffb54;
  ImVec2 in_stack_fffffffffffffb58;
  ImVec2 in_stack_fffffffffffffb60;
  ImVec2 in_stack_fffffffffffffb68;
  ImVec2 in_stack_fffffffffffffb70;
  ImVec2 in_stack_fffffffffffffb78;
  ImVec2 in_stack_fffffffffffffb80;
  ImVec2 in_stack_fffffffffffffb88;
  ImVec2 in_stack_fffffffffffffb90;
  float fVar7;
  float local_41c;
  byte local_3e9;
  ImGuiTextFlags in_stack_fffffffffffffc34;
  float fVar8;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  float local_3b8;
  float in_stack_fffffffffffffc74;
  ImVec4 *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  byte bVar9;
  uint local_378;
  float in_stack_fffffffffffffc8c;
  float in_stack_fffffffffffffc90;
  ImVec2 local_368;
  ImVec2 local_360;
  ImVec2 local_358;
  float local_34c;
  ImVec2 local_348;
  ImVec2 local_340;
  ImVec2 local_338;
  ImRect local_330;
  float local_320;
  ImU32 local_31c;
  ImVec2 local_318;
  ImVec2 local_310;
  float in_stack_fffffffffffffcfc;
  ImVec2 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  float in_stack_fffffffffffffd0c;
  ImVec2 local_2ec;
  int local_2e4;
  undefined1 local_2e0 [8];
  ImVec2 local_2d8;
  ImVec2 local_2d0;
  undefined1 local_2c8 [8];
  ImVec2 local_2c0;
  undefined1 local_2b8 [8];
  ImVec2 local_2b0;
  ImVec2 local_2a8;
  ImVec2 local_2a0;
  ImVec2 local_298;
  ImVec2 local_290;
  ImVec2 local_288;
  ImVec2 local_280;
  ImVec2 local_278;
  ImVec2 local_270;
  ImVec2 local_268;
  int local_260;
  float local_25c;
  ImVec2 local_258;
  float local_250;
  float local_24c;
  ImVec2 local_248;
  ImVec2 local_240;
  ImVec2 local_234;
  ImVec2 local_22c;
  int local_224;
  int local_220;
  float local_21c;
  float local_218;
  int local_214;
  int local_210;
  float local_20c;
  ImVec2 local_208;
  ImVec4 local_200;
  ImU32 local_1f0;
  ImU32 local_1ec;
  ImVec4 local_1e8;
  uint local_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  int local_1b4;
  int local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  uint local_1a0;
  undefined4 local_19c;
  byte local_195;
  ImVec2 local_194;
  ImVec4 local_18c;
  ImVec2 local_17c;
  undefined4 local_174;
  ImVec4 local_170;
  char *local_160;
  ImVec2 local_154;
  ImVec2 local_14c;
  ImVec2 local_144;
  ImVec2 local_13c;
  ImVec2 local_134;
  ImVec2 local_12c;
  float local_124;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  float local_108;
  float local_104;
  float local_100;
  ImVec2 local_fc;
  ImVec2 local_f4;
  ImVec2 local_ec;
  byte local_e3;
  byte local_e2;
  byte local_e1;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  float local_b0;
  ImVec4 local_ac;
  float local_9c;
  undefined1 local_98 [28];
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  ImVec2 local_64;
  byte local_59;
  int local_58;
  float local_54;
  ImGuiIO *local_50;
  ImGuiStyle *local_48;
  ImVec2 local_40;
  ImGuiWindow *local_38;
  ImGuiContext *local_30;
  float *local_28;
  uint local_1c;
  float *local_18;
  char *local_10;
  
  local_30 = GImGui;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_38 = GetCurrentWindow();
  if ((local_38->SkipItems & 1U) != 0) {
    return false;
  }
  local_40 = (ImVec2)local_38->DrawList;
  local_48 = &local_30->Style;
  local_50 = &local_30->IO;
  local_54 = CalcItemWidth();
  ImGuiNextItemData::ClearFlags(&local_30->NextItemData);
  PushID((char *)in_stack_fffffffffffffb20);
  BeginGroup();
  if ((local_1c & 0x100) == 0) {
    local_1c = local_1c | 0x10;
  }
  if ((local_1c & 8) == 0) {
    ColorPickerOptionsPopup
              ((float *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
               (ImGuiColorEditFlags)in_stack_fffffffffffffb4c);
  }
  if ((local_1c & 0x6000000) == 0) {
    if ((local_30->ColorEditOptions & 0x6000000U) == 0) {
      in_stack_fffffffffffffc8c = 1.3866696e-32;
    }
    else {
      in_stack_fffffffffffffc8c = (float)local_30->ColorEditOptions;
    }
    local_1c = (uint)in_stack_fffffffffffffc8c & 0x6000000 | local_1c;
  }
  if ((local_1c & 0x18000000) == 0) {
    if ((local_30->ColorEditOptions & 0x18000000U) == 0) {
      local_378 = 0xa900000;
    }
    else {
      local_378 = local_30->ColorEditOptions;
    }
    local_1c = local_378 & 0x18000000 | local_1c;
  }
  bVar1 = ImIsPowerOfTwo(local_1c & 0x6000000);
  if (!bVar1) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1206,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  bVar1 = ImIsPowerOfTwo(local_1c & 0x18000000);
  if (!bVar1) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1207,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((local_1c & 8) == 0) {
    local_1c = local_30->ColorEditOptions & 0x10000U | local_1c;
  }
  local_58 = 4;
  if ((local_1c & 2) != 0) {
    local_58 = 3;
  }
  bVar9 = 0;
  if ((local_1c & 0x10000) != 0) {
    bVar9 = (local_1c & 2) != 0 ^ 0xff;
  }
  local_59 = bVar9 & 1;
  local_64 = (local_38->DC).CursorPos;
  local_6c = GetFrameHeight();
  iVar2 = 1;
  if ((local_59 & 1) != 0) {
    iVar2 = 2;
  }
  local_68 = local_6c;
  local_70 = ImMax<float>(local_6c * 1.0,
                          -(float)iVar2 * (local_6c + (local_48->ItemInnerSpacing).x) + local_54);
  local_74 = local_64.x + local_70 + (local_48->ItemInnerSpacing).x;
  local_78 = local_74 + local_6c + (local_48->ItemInnerSpacing).x;
  local_7c = (float)(int)(local_6c * 0.2);
  memcpy(local_98,local_18,(long)local_58 << 2);
  local_9c = local_70 * 0.08;
  local_ac.w = local_70 * 0.5;
  local_ac.z = local_ac.w - local_9c;
  ImVec2::ImVec2((ImVec2 *)&local_ac,(local_70 + local_6c) * 0.5 + local_64.x,
                 local_70 * 0.5 + local_64.y);
  local_b0 = local_ac.z - (float)(int)(local_70 * 0.027);
  ImVec2::ImVec2(&local_b8,local_b0,0.0);
  ImVec2::ImVec2(&local_c0,local_b0 * -0.5,local_b0 * -0.866025);
  ImVec2::ImVec2(&local_c8,local_b0 * -0.5,local_b0 * 0.866025);
  local_cc = *local_18;
  local_d0 = local_18[1];
  local_d4 = local_18[2];
  local_d8 = *local_18;
  local_dc = local_18[1];
  local_e0 = local_18[2];
  if ((local_1c & 0x8000000) == 0) {
    if ((local_1c & 0x10000000) != 0) {
      ColorConvertHSVtoRGB
                (in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (float *)in_stack_fffffffffffffb40,
                 (float *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (float *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    }
  }
  else {
    ColorConvertRGBtoHSV
              (in_stack_fffffffffffffb34,in_stack_fffffffffffffb30,
               (float)((ulong)in_stack_fffffffffffffb28 >> 0x20),(float *)in_stack_fffffffffffffb20,
               (float *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (float *)in_stack_fffffffffffffb10);
    iVar2 = memcmp(local_30->ColorEditLastColor,local_18,0xc);
    if (iVar2 == 0) {
      if ((local_d0 == 0.0) && (!NAN(local_d0))) {
        local_cc = local_30->ColorEditLastHue;
      }
      if ((local_d4 == 0.0) && (!NAN(local_d4))) {
        local_d0 = local_30->ColorEditLastSat;
      }
    }
  }
  local_e1 = 0;
  local_e2 = 0;
  local_e3 = 0;
  PushItemFlag((ImGuiItemFlags)in_stack_fffffffffffffb10.y,in_stack_fffffffffffffb10.x._3_1_);
  if ((local_1c & 0x4000000) == 0) {
    if ((local_1c & 0x2000000) != 0) {
      ImVec2::ImVec2(&local_134,local_70,local_70);
      InvisibleButton((char *)in_stack_fffffffffffffb58,
                      (ImVec2 *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
      bVar1 = IsItemActive();
      if (bVar1) {
        local_d0 = ImSaturate(((local_50->MousePos).x - local_64.x) / (local_70 - 1.0));
        local_d4 = ImSaturate(((local_50->MousePos).y - local_64.y) / (local_70 - 1.0));
        local_d4 = 1.0 - local_d4;
        local_e3 = 1;
        local_e1 = 1;
      }
      if ((local_1c & 8) == 0) {
        OpenPopupOnItemClick
                  ((char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                   (ImGuiMouseButton)in_stack_fffffffffffffb10.y);
      }
      ImVec2::ImVec2(&local_13c,local_74,local_64.y);
      SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffffb10);
      ImVec2::ImVec2(&local_144,local_6c,local_70);
      InvisibleButton((char *)in_stack_fffffffffffffb58,
                      (ImVec2 *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
      bVar1 = IsItemActive();
      if (bVar1) {
        local_cc = ImSaturate(((local_50->MousePos).y - local_64.y) / (local_70 - 1.0));
        local_e2 = 1;
        local_e1 = 1;
      }
    }
  }
  else {
    ImVec2::ImVec2(&local_ec,local_70 + (local_48->ItemInnerSpacing).x + local_6c,local_70);
    InvisibleButton((char *)in_stack_fffffffffffffb58,
                    (ImVec2 *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    bVar1 = IsItemActive();
    if (bVar1) {
      in_stack_fffffffffffffc78 = &local_ac;
      local_f4 = operator-(in_stack_fffffffffffffb08,(ImVec2 *)0x1d35ce);
      local_fc = operator-(in_stack_fffffffffffffb08,(ImVec2 *)0x1d35f3);
      local_100 = ImLengthSqr(&local_f4);
      if (((local_ac.z - 1.0) * (local_ac.z - 1.0) <= local_100) &&
         (local_100 <= (local_ac.w + 1.0) * (local_ac.w + 1.0))) {
        fVar8 = atan2f(local_fc.y,local_fc.x);
        local_cc = (fVar8 / 3.1415927) * 0.5;
        if (local_cc < 0.0) {
          local_cc = local_cc + 1.0;
        }
        local_e2 = 1;
        local_e1 = 1;
      }
      in_stack_fffffffffffffc74 = 3.1415927;
      local_104 = cosf((-local_cc - local_cc) * 3.1415927);
      local_108 = sinf((-local_cc - local_cc) * in_stack_fffffffffffffc74);
      local_110 = ImRotate(in_stack_fffffffffffffb08,0.0,2.683163e-39);
      bVar1 = ImTriangleContainsPoint(&local_b8,&local_c0,&local_c8,&local_110);
      if (bVar1) {
        local_118 = ImRotate(in_stack_fffffffffffffb08,0.0,2.683283e-39);
        bVar1 = ImTriangleContainsPoint(&local_b8,&local_c0,&local_c8,&local_118);
        if (!bVar1) {
          local_120 = ImTriangleClosestPoint
                                ((ImVec2 *)in_stack_fffffffffffffb68,
                                 (ImVec2 *)in_stack_fffffffffffffb60,
                                 (ImVec2 *)in_stack_fffffffffffffb58,
                                 (ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
          local_118 = local_120;
        }
        in_stack_fffffffffffffb08 = &local_12c;
        ImTriangleBarycentricCoords
                  ((ImVec2 *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   (ImVec2 *)in_stack_fffffffffffffb40,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                   (float *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   &in_stack_fffffffffffffb28->x,(float *)in_stack_fffffffffffffb60);
        local_d4 = ImClamp<float>(1.0 - local_12c.y,0.0001,1.0);
        local_d0 = ImClamp<float>(local_124 / local_d4,0.0001,1.0);
        local_e3 = 1;
        local_e1 = 1;
      }
    }
    if ((local_1c & 8) == 0) {
      OpenPopupOnItemClick
                ((char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                 (ImGuiMouseButton)in_stack_fffffffffffffb10.y);
    }
  }
  if ((local_59 & 1) != 0) {
    ImVec2::ImVec2(&local_14c,local_78,local_64.y);
    SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffffb10);
    ImVec2::ImVec2(&local_154,local_6c,local_70);
    InvisibleButton((char *)in_stack_fffffffffffffb58,
                    (ImVec2 *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    bVar1 = IsItemActive();
    if (bVar1) {
      fVar8 = ImSaturate(((local_50->MousePos).y - local_64.y) / (local_70 - 1.0));
      local_18[3] = 1.0 - fVar8;
      local_e1 = 1;
    }
  }
  PopItemFlag();
  if ((local_1c & 0x100) == 0) {
    SameLine(in_stack_fffffffffffffb10.y,in_stack_fffffffffffffb10.x);
    BeginGroup();
  }
  if (((local_1c & 0x80) == 0) &&
     (local_160 = FindRenderedTextEnd(local_10,(char *)0x0), local_10 != local_160)) {
    if ((local_1c & 0x100) != 0) {
      SameLine(in_stack_fffffffffffffb10.y,in_stack_fffffffffffffb10.x);
    }
    TextEx((char *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
           (char *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
           in_stack_fffffffffffffc34);
  }
  if ((local_1c & 0x100) == 0) {
    PushItemFlag((ImGuiItemFlags)in_stack_fffffffffffffb10.y,in_stack_fffffffffffffb10.x._3_1_);
    if ((local_1c & 2) == 0) {
      local_3b8 = local_18[3];
    }
    else {
      local_3b8 = 1.0;
    }
    ImVec4::ImVec4(&local_170,*local_18,local_18[1],local_18[2],local_3b8);
    if ((local_1c & 0x80) != 0) {
      Text("Current");
    }
    local_174 = 0x180e0040;
    ImVec2::ImVec2(&local_17c,local_68 * 3.0,local_68 + local_68);
    size.y = in_stack_fffffffffffffc90;
    size.x = in_stack_fffffffffffffc8c;
    ColorButton((char *)CONCAT17(bVar9,in_stack_fffffffffffffc80),in_stack_fffffffffffffc78,
                (ImGuiColorEditFlags)in_stack_fffffffffffffc74,size);
    if (local_28 != (float *)0x0) {
      Text("Original");
      if ((local_1c & 2) == 0) {
        fVar8 = local_28[3];
      }
      else {
        fVar8 = 1.0;
      }
      ImVec4::ImVec4(&local_18c,*local_28,local_28[1],local_28[2],fVar8);
      ImVec2::ImVec2(&local_194,local_68 * 3.0,local_68 + local_68);
      size_00.y = in_stack_fffffffffffffc90;
      size_00.x = in_stack_fffffffffffffc8c;
      bVar1 = ColorButton((char *)CONCAT17(bVar9,in_stack_fffffffffffffc80),
                          in_stack_fffffffffffffc78,(ImGuiColorEditFlags)in_stack_fffffffffffffc74,
                          size_00);
      if (bVar1) {
        memcpy(local_18,local_28,(long)local_58 << 2);
        local_e1 = 1;
      }
    }
    PopItemFlag();
    EndGroup();
  }
  if (((local_e2 & 1) != 0) || ((local_e3 & 1) != 0)) {
    if ((local_1c & 0x8000000) == 0) {
      if ((local_1c & 0x10000000) != 0) {
        *local_18 = local_cc;
        local_18[1] = local_d0;
        local_18[2] = local_d4;
      }
    }
    else {
      ColorConvertHSVtoRGB
                (in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (float *)in_stack_fffffffffffffb40,
                 (float *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (float *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      local_30->ColorEditLastHue = local_cc;
      local_30->ColorEditLastSat = local_d0;
      *(undefined8 *)local_30->ColorEditLastColor = *(undefined8 *)local_18;
      local_30->ColorEditLastColor[2] = local_18[2];
    }
  }
  local_195 = 0;
  if ((local_1c & 0x20) == 0) {
    PushItemWidth((float)((ulong)in_stack_fffffffffffffb20 >> 0x20));
    local_19c = 0x198e001a;
    local_1a0 = local_1c & 0x198e001a | 4;
    if ((((local_1c & 0x100000) != 0) || ((local_1c & 0x700000) == 0)) &&
       (bVar1 = ColorEdit4((char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                           (float *)in_stack_fffffffffffffd00,
                           (ImGuiColorEditFlags)in_stack_fffffffffffffcfc), bVar1)) {
      local_3e9 = 0;
      if (local_30->ActiveId != 0) {
        local_3e9 = local_30->ActiveIdAllowOverlap ^ 0xff;
      }
      local_195 = local_3e9 & 1;
      local_e1 = 1;
    }
    if (((local_1c & 0x200000) != 0) || ((local_1c & 0x700000) == 0)) {
      bVar1 = ColorEdit4((char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                         (float *)in_stack_fffffffffffffd00,
                         (ImGuiColorEditFlags)in_stack_fffffffffffffcfc);
      local_e1 = (local_e1 & 1) != 0 || bVar1;
    }
    if (((local_1c & 0x400000) != 0) || ((local_1c & 0x700000) == 0)) {
      bVar1 = ColorEdit4((char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                         (float *)in_stack_fffffffffffffd00,
                         (ImGuiColorEditFlags)in_stack_fffffffffffffcfc);
      local_e1 = (local_e1 & 1) != 0 || bVar1;
    }
    PopItemWidth();
  }
  if (((((local_195 & 1) != 0) && ((local_1c & 0x8000000) != 0)) &&
      (ColorConvertRGBtoHSV
                 (in_stack_fffffffffffffb34,in_stack_fffffffffffffb30,
                  (float)((ulong)in_stack_fffffffffffffb28 >> 0x20),
                  (float *)in_stack_fffffffffffffb20,
                  (float *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                  (float *)in_stack_fffffffffffffb10), local_1a4 <= 0.0)) && (0.0 < local_cc)) {
    if (local_1ac <= 0.0) {
      if ((local_d4 != local_1ac) || (NAN(local_d4) || NAN(local_1ac))) {
        ColorConvertHSVtoRGB
                  (in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                   (float *)in_stack_fffffffffffffb40,
                   (float *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                   (float *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
        goto LAB_001d4529;
      }
    }
    if (local_1a8 <= 0.0) {
      ColorConvertHSVtoRGB
                (in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (float *)in_stack_fffffffffffffb40,
                 (float *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (float *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    }
  }
LAB_001d4529:
  if ((local_e1 & 1) != 0) {
    if ((local_1c & 0x8000000) == 0) {
      if ((local_1c & 0x10000000) != 0) {
        local_cc = *local_18;
        local_d0 = local_18[1];
        local_d4 = local_18[2];
        ColorConvertHSVtoRGB
                  (in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                   (float *)in_stack_fffffffffffffb40,
                   (float *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                   (float *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      }
    }
    else {
      local_d8 = *local_18;
      local_dc = local_18[1];
      local_e0 = local_18[2];
      ColorConvertRGBtoHSV
                (in_stack_fffffffffffffb34,in_stack_fffffffffffffb30,
                 (float)((ulong)in_stack_fffffffffffffb28 >> 0x20),
                 (float *)in_stack_fffffffffffffb20,
                 (float *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                 (float *)in_stack_fffffffffffffb10);
      iVar2 = memcmp(local_30->ColorEditLastColor,local_18,0xc);
      if (iVar2 == 0) {
        if ((local_d0 == 0.0) && (!NAN(local_d0))) {
          local_cc = local_30->ColorEditLastHue;
        }
        if ((local_d4 == 0.0) && (!NAN(local_d4))) {
          local_d0 = local_30->ColorEditLastSat;
        }
      }
    }
  }
  fVar8 = ImSaturate(local_48->Alpha);
  local_1b0 = (int)(fVar8 * 255.0 + 0.5);
  local_1b4 = local_1b0 << 0x18;
  local_1b8 = local_1b0 << 0x18 | 0xffffff;
  local_1bc = local_1b0 << 0x18 | 0x808080;
  local_1d8 = local_1b0 << 0x18 | 0xff;
  local_1d4 = local_1b0 << 0x18 | 0xffff;
  local_1d0 = local_1b0 << 0x18 | 0xff00;
  local_1cc = local_1b0 << 0x18 | 0xffff00;
  local_1c8 = local_1b0 << 0x18 | 0xff0000;
  local_1c4 = local_1b0 << 0x18 | 0xff00ff;
  local_1c0 = local_1b0 << 0x18 | 0xff;
  ImVec4::ImVec4(&local_1e8,1.0,1.0,1.0,local_48->Alpha);
  ColorConvertHSVtoRGB
            (in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
             (float *)in_stack_fffffffffffffb40,
             (float *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
             (float *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  local_1ec = ColorConvertFloat4ToU32((ImVec4 *)in_stack_fffffffffffffb10);
  ImVec4::ImVec4(&local_200,local_d8,local_dc,local_e0,local_48->Alpha);
  local_1f0 = ColorConvertFloat4ToU32((ImVec4 *)in_stack_fffffffffffffb10);
  ImVec2::ImVec2(&local_208);
  if ((local_1c & 0x4000000) == 0) {
    if ((local_1c & 0x2000000) != 0) {
      in_stack_fffffffffffffb68 = (ImVec2)local_2b8;
      in_stack_fffffffffffffb70 = local_40;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffb68,local_70,local_70);
      in_stack_fffffffffffffb88 = (ImVec2)&local_64;
      local_2b0 = operator+(in_stack_fffffffffffffb08,(ImVec2 *)0x1d5110);
      pIVar5 = (ImVec2 *)CONCAT44((int)((ulong)in_stack_fffffffffffffb08 >> 0x20),local_1b8);
      ImDrawList::AddRectFilledMultiColor
                (in_stack_fffffffffffffb40,
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (ImU32)((ulong)in_stack_fffffffffffffb28 >> 0x20),(ImU32)in_stack_fffffffffffffb28,
                 (ImU32)((ulong)in_stack_fffffffffffffb20 >> 0x20),(ImU32)in_stack_fffffffffffffb50)
      ;
      in_stack_fffffffffffffb78 = (ImVec2)local_2c8;
      in_stack_fffffffffffffb80 = local_40;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffb78,local_70,local_70);
      local_2c0 = operator+(pIVar5,(ImVec2 *)0x1d5187);
      pIVar5 = (ImVec2 *)CONCAT44((int)((ulong)pIVar5 >> 0x20),local_1b4);
      ImDrawList::AddRectFilledMultiColor
                (in_stack_fffffffffffffb40,
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (ImU32)((ulong)in_stack_fffffffffffffb28 >> 0x20),(ImU32)in_stack_fffffffffffffb28,
                 (ImU32)((ulong)in_stack_fffffffffffffb20 >> 0x20),(ImU32)in_stack_fffffffffffffb50)
      ;
      local_2d0 = local_64;
      in_stack_fffffffffffffb90 = (ImVec2)local_2e0;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffb90,local_70,local_70);
      local_2d8 = operator+(pIVar5,(ImVec2 *)0x1d5204);
      RenderFrameBorder(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                        in_stack_fffffffffffffb60.y);
      fVar8 = local_64.x;
      fVar7 = ImSaturate(local_d0);
      local_208.x = ImClamp<float>((float)(int)(fVar7 * local_70 + fVar8 + 0.5),local_64.x + 2.0,
                                   (local_64.x + local_70) - 2.0);
      fVar8 = local_64.y;
      fVar7 = ImSaturate(1.0 - local_d4);
      fVar8 = ImClamp<float>((float)(int)(fVar7 * local_70 + fVar8 + 0.5),local_64.y + 2.0,
                             (local_64.y + local_70) - 2.0);
      local_208.y = fVar8;
      for (local_2e4 = 0; local_2e4 < 6; local_2e4 = local_2e4 + 1) {
        in_stack_fffffffffffffb60 = local_40;
        ImVec2::ImVec2(&local_2ec,local_74,(float)local_2e4 * (local_70 / 6.0) + local_64.y);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd0c,local_74 + local_6c,
                       (float)(local_2e4 + 1) * (local_70 / 6.0) + local_64.y);
        ImDrawList::AddRectFilledMultiColor
                  (in_stack_fffffffffffffb40,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   (ImU32)((ulong)in_stack_fffffffffffffb28 >> 0x20),
                   (ImU32)in_stack_fffffffffffffb28,
                   (ImU32)((ulong)in_stack_fffffffffffffb20 >> 0x20),
                   (ImU32)in_stack_fffffffffffffb50);
      }
      fVar8 = (float)(int)(local_cc * local_70 + local_64.y + 0.5);
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd00,local_74,local_64.y);
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffcf8,local_74 + local_6c,local_64.y + local_70);
      RenderFrameBorder(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                        in_stack_fffffffffffffb60.y);
      fVar7 = 1.0;
      in_stack_fffffffffffffb58 = local_40;
      ImVec2::ImVec2(&local_310,local_74 - 1.0,fVar8);
      ImVec2::ImVec2(&local_318,local_7c + fVar7,local_7c);
      RenderArrowsForVerticalBar
                ((ImDrawList *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb90,
                 in_stack_fffffffffffffb88,in_stack_fffffffffffffb78.y,in_stack_fffffffffffffb78.x);
    }
  }
  else {
    local_20c = 0.5 / local_ac.w;
    local_210 = ImMax<int>(4,(int)local_ac.w / 0xc);
    for (local_214 = 0; local_214 < 6; local_214 = local_214 + 1) {
      local_218 = ((float)local_214 / 6.0 + (float)local_214 / 6.0) * 3.1415927 - local_20c;
      fVar8 = ((float)local_214 + 1.0) / 6.0;
      local_21c = (fVar8 + fVar8) * 3.1415927 + local_20c;
      local_220 = ((ImVector<ImDrawVert> *)((long)local_40 + 0x20))->Size;
      ImDrawList::PathArcTo
                ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 (float)((ulong)in_stack_fffffffffffffb40 >> 0x20),
                 SUB84(in_stack_fffffffffffffb40,0),in_stack_fffffffffffffb3c,
                 in_stack_fffffffffffffb38);
      ImDrawList::PathStroke
                (in_stack_fffffffffffffb20,(ImU32)in_stack_fffffffffffffb1c,
                 SUB41((uint)in_stack_fffffffffffffb18 >> 0x18,0),in_stack_fffffffffffffb10.y);
      fVar8 = local_ac.x;
      local_224 = ((ImVector<ImDrawVert> *)((long)local_40 + 0x20))->Size;
      fVar3 = cosf(local_218);
      fVar7 = local_ac.y;
      fVar3 = fVar3 * local_ac.z;
      fVar4 = sinf(local_218);
      ImVec2::ImVec2(&local_22c,fVar3 + fVar8,fVar4 * local_ac.z + fVar7);
      fVar8 = local_ac.x;
      fVar3 = cosf(local_21c);
      fVar7 = local_ac.y;
      fVar3 = fVar3 * local_ac.z;
      fVar4 = sinf(local_21c);
      ImVec2::ImVec2(&local_234,fVar3 + fVar8,fVar4 * local_ac.z + fVar7);
      local_240 = local_22c;
      local_248 = local_234;
      ShadeVertsLinearColorGradientKeepAlpha
                ((ImDrawList *)in_stack_fffffffffffffb60,(int)in_stack_fffffffffffffb58.y,
                 (int)in_stack_fffffffffffffb58.x,in_stack_fffffffffffffb70,
                 in_stack_fffffffffffffb68,(ImU32)in_stack_fffffffffffffb54,
                 (ImU32)in_stack_fffffffffffffb50);
    }
    local_24c = cosf(local_cc * 2.0 * 3.1415927);
    local_250 = sinf(local_cc * 2.0 * 3.1415927);
    ImVec2::ImVec2(&local_258,local_24c * (local_ac.z + local_ac.w) * 0.5 + local_ac.x,
                   local_250 * (local_ac.z + local_ac.w) * 0.5 + local_ac.y);
    if ((local_e2 & 1) == 0) {
      local_41c = local_9c * 0.55;
    }
    else {
      local_41c = local_9c * 0.65;
    }
    local_25c = local_41c;
    local_260 = ImClamp<int>((int)(local_41c / 1.4),9,0x20);
    ImDrawList::AddCircleFilled
              ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28,(float)((ulong)in_stack_fffffffffffffb20 >> 0x20),
               (ImU32)in_stack_fffffffffffffb20,(int)in_stack_fffffffffffffb1c);
    fVar7 = 1.0;
    ImDrawList::AddCircle
              ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28,(float)((ulong)in_stack_fffffffffffffb20 >> 0x20),
               (ImU32)in_stack_fffffffffffffb20,(int)in_stack_fffffffffffffb1c,
               in_stack_fffffffffffffb18);
    ImDrawList::AddCircle
              ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28,(float)((ulong)in_stack_fffffffffffffb20 >> 0x20),
               (ImU32)in_stack_fffffffffffffb20,(int)in_stack_fffffffffffffb1c,
               in_stack_fffffffffffffb18);
    local_270 = ImRotate(in_stack_fffffffffffffb08,0.0,2.691274e-39);
    local_268 = operator+(in_stack_fffffffffffffb08,(ImVec2 *)0x1d4e53);
    local_280 = ImRotate(in_stack_fffffffffffffb08,0.0,2.691383e-39);
    local_278 = operator+(in_stack_fffffffffffffb08,(ImVec2 *)0x1d4e99);
    local_290 = ImRotate(in_stack_fffffffffffffb08,0.0,2.691481e-39);
    local_288 = operator+(in_stack_fffffffffffffb08,(ImVec2 *)0x1d4edf);
    fVar8 = (float)((ulong)in_stack_fffffffffffffb08 >> 0x20);
    local_298 = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve
              (in_stack_fffffffffffffb20,(int)in_stack_fffffffffffffb1c,
               (int)in_stack_fffffffffffffb18);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb20,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                        (ImVec2 *)in_stack_fffffffffffffb10,(ImU32)fVar8);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb20,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                        (ImVec2 *)in_stack_fffffffffffffb10,(ImU32)fVar8);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb20,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                        (ImVec2 *)in_stack_fffffffffffffb10,(ImU32)fVar8);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb20,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                        (ImVec2 *)in_stack_fffffffffffffb10,(ImU32)fVar8);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb20,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                        (ImVec2 *)in_stack_fffffffffffffb10,(ImU32)fVar8);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb20,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                        (ImVec2 *)in_stack_fffffffffffffb10,(ImU32)fVar8);
    ImDrawList::AddTriangle
              ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28,(ImVec2 *)in_stack_fffffffffffffb20,
               (ImVec2 *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (ImU32)in_stack_fffffffffffffb10.y,in_stack_fffffffffffffb10.x);
    ImSaturate(local_d0);
    local_2a8 = ImLerp((ImVec2 *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                       (ImVec2 *)in_stack_fffffffffffffb10,fVar8);
    ImSaturate(fVar7 - local_d4);
    local_2a0 = ImLerp((ImVec2 *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                       (ImVec2 *)in_stack_fffffffffffffb10,fVar8);
    local_208 = local_2a0;
  }
  col_bot_left = 0x41200000;
  if ((local_e3 & 1) == 0) {
    col_bot_left = 0x40c00000;
  }
  local_31c = col_bot_left;
  ImDrawList::AddCircleFilled
            ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
             in_stack_fffffffffffffb28,(float)((ulong)in_stack_fffffffffffffb20 >> 0x20),
             (ImU32)in_stack_fffffffffffffb20,(int)in_stack_fffffffffffffb1c);
  ImDrawList::AddCircle
            ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
             in_stack_fffffffffffffb28,(float)((ulong)in_stack_fffffffffffffb20 >> 0x20),
             (ImU32)in_stack_fffffffffffffb20,(int)in_stack_fffffffffffffb1c,
             in_stack_fffffffffffffb18);
  ImDrawList::AddCircle
            ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
             in_stack_fffffffffffffb28,(float)((ulong)in_stack_fffffffffffffb20 >> 0x20),
             (ImU32)in_stack_fffffffffffffb20,(int)in_stack_fffffffffffffb1c,
             in_stack_fffffffffffffb18);
  if ((local_59 & 1) != 0) {
    local_320 = ImSaturate(local_18[3]);
    this = &local_330;
    ImRect::ImRect(this,in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18,
                   in_stack_fffffffffffffb10.y,in_stack_fffffffffffffb10.x);
    local_338 = local_330.Min;
    pIVar5 = &local_330.Max;
    local_340 = local_330.Max;
    in_stack_fffffffffffffb10 = local_40;
    ImRect::GetWidth(this);
    col_bot_right = (ImU32)((ulong)this >> 0x20);
    fVar8 = 0.5;
    uVar6 = 0;
    ImVec2::ImVec2(&local_348,0.0,0.0);
    RenderColorRectWithAlphaCheckerboard
              ((ImDrawList *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb80,
               in_stack_fffffffffffffb78,(ImU32)in_stack_fffffffffffffb60.y,
               in_stack_fffffffffffffb60.x,in_stack_fffffffffffffb70,in_stack_fffffffffffffb58.y,
               (int)in_stack_fffffffffffffb58.x);
    fVar3 = in_stack_fffffffffffffb60.y;
    ImDrawList::AddRectFilledMultiColor
              (in_stack_fffffffffffffb40,(ImVec2 *)CONCAT44(in_stack_fffffffffffffb3c,uVar6),
               (ImVec2 *)CONCAT44(fVar8,in_stack_fffffffffffffb30),(ImU32)((ulong)pIVar5 >> 0x20),
               (ImU32)pIVar5,col_bot_right,col_bot_left);
    fVar7 = 1.0;
    local_34c = (float)(int)((1.0 - local_320) * local_70 + local_64.y + fVar8);
    local_358 = local_330.Min;
    local_360 = local_330.Max;
    RenderFrameBorder(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,fVar3);
    ImVec2::ImVec2(&local_368,local_78 - fVar7,local_34c);
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffc90,local_7c + fVar7,local_7c);
    RenderArrowsForVerticalBar
              ((ImDrawList *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb88,in_stack_fffffffffffffb78.y,in_stack_fffffffffffffb78.x);
  }
  fVar8 = in_stack_fffffffffffffb10.y;
  EndGroup();
  if (((local_e1 & 1) != 0) && (iVar2 = memcmp(local_98,local_18,(long)local_58 << 2), iVar2 == 0))
  {
    local_e1 = 0;
  }
  if ((local_e1 & 1) != 0) {
    MarkItemEdited((ImGuiID)fVar8);
  }
  PopID();
  return (bool)(local_e1 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0)
        {
            if (S == 0)
                H = g.ColorEditLastHue;
            if (V == 0)
                S = g.ColorEditLastSat;
        }
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            memcpy(g.ColorEditLastColor, col, sizeof(float) * 3);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0) // Fix local Hue as display below will use it immediately.
            {
                if (S == 0)
                    H = g.ColorEditLastHue;
                if (V == 0)
                    S = g.ColorEditLastSat;
            }
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}